

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  uint uVar1;
  uint uVar2;
  crn_format cVar3;
  level_details *plVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  int iVar6;
  uint uVar7;
  crn_comp_params *pcVar8;
  color_quad_u8 (*blocks) [16];
  uint uVar9;
  uint dy;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  ulong uVar21;
  bool bVar22;
  uint uVar24;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar23 [16];
  uint uVar25;
  uint uVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float local_1ec;
  uint y0;
  undefined1 local_188 [280];
  uint uStack_70;
  ulong uStack_6c;
  float local_64;
  float fStack_60;
  float local_5c;
  uint local_58 [2];
  task_pool *local_50;
  bool local_48;
  crn_progress_callback_func local_40;
  void *pvStack_38;
  
  uStack_6c = stack0xffffffffffffff8c;
  dxt_hc::params::params((params *)local_188);
  pcVar8 = this->m_pParams;
  local_64 = pcVar8->m_crn_adaptive_tile_color_psnr_derating;
  fStack_60 = pcVar8->m_crn_adaptive_tile_alpha_psnr_derating;
  uVar10 = pcVar8->m_flags;
  if ((uVar10 & 0x40) == 0) {
    uVar10 = (pcVar8->m_height + 3 >> 2) * (pcVar8->m_width + 3 >> 2);
    if (0x1fff < uVar10) {
      uVar10 = 0x2000;
    }
    uVar15 = 8;
    if (8 < uVar10) {
      uVar15 = uVar10;
    }
    fVar35 = (float)pcVar8->m_quality_level / 255.0;
    fVar36 = 1.0;
    if (this->m_has_etc_color_blocks == true) {
      bVar22 = this->m_has_subblocks != false;
      if (bVar22) {
        fVar36 = 1.31;
        if (bVar22) goto LAB_001672fa;
LAB_0016735c:
        local_64 = 2.0;
      }
      else {
        fVar36 = 0.7;
        if (!bVar22) goto LAB_0016735c;
LAB_001672fa:
        local_64 = 5.0;
      }
    }
    fVar33 = 1.0;
    if (fVar35 <= 1.0) {
      fVar33 = fVar35;
    }
    cVar3 = pcVar8->m_format;
    if (cVar3 == cCRNFmtDXT5) {
      fVar36 = 0.75;
LAB_001673af:
      local_1ec = 1.0;
    }
    else if (cVar3 == cCRNFmtETC2A) {
      local_1ec = 0.9;
    }
    else {
      if (cVar3 != cCRNFmtDXT5_CCxY) goto LAB_001673af;
      local_64 = 5.0;
      fVar36 = 3.5;
      local_1ec = 0.35;
    }
    fVar35 = powf(fVar33,fVar36 * 1.8);
    fVar36 = powf(fVar33,fVar36 * 1.65);
    fVar35 = fVar35 * (float)(int)(uVar15 - 0x40) + 64.0 + 0.5;
    fVar36 = fVar36 * (float)(int)(uVar15 - 0x60) + 96.0 + 0.5;
    uVar10 = (uint)fVar35;
    uVar24 = (uint)fVar36;
    uVar10 = (int)(fVar35 - 2.1474836e+09) & (int)uVar10 >> 0x1f | uVar10;
    uVar24 = (int)(fVar36 - 2.1474836e+09) & (int)uVar24 >> 0x1f | uVar24;
    uVar25 = -(uint)((int)(uVar10 ^ 0x80000000) < -0x7fffe000);
    uVar29 = -(uint)((int)(uVar24 ^ 0x80000000) < -0x7fffe000);
    uVar25 = ~uVar25 & 0x2000 | uVar10 & uVar25;
    uVar29 = ~uVar29 & 0x2000 | uVar24 & uVar29;
    uVar10 = -(uint)(-0x7ffffff8 < (int)(uVar25 ^ 0x80000000));
    uVar24 = -(uint)(-0x7ffffff8 < (int)(uVar29 ^ 0x80000000));
    uStack_70 = ~uVar24 & 8 | uVar29 & uVar24;
    local_188._276_4_ = ~uVar10 & 8 | uVar25 & uVar10;
    fVar36 = powf(fVar33,local_1ec * 2.1);
    fVar35 = powf(fVar33,local_1ec * 1.65);
    fVar36 = fVar36 * (float)(int)(uVar15 - 0x18) + 24.0 + 0.5;
    fVar35 = fVar35 * (float)(int)(uVar15 - 0x30) + 48.0 + 0.5;
    fVar33 = extraout_XMM0_Db * 0.0 + 0.0 + 0.0;
    fVar34 = extraout_XMM0_Db_00 * 0.0 + 0.0 + 0.0;
    auVar32._0_4_ = (int)fVar36;
    auVar32._4_4_ = (int)fVar35;
    auVar32._8_4_ = (int)fVar33;
    auVar32._12_4_ = (int)fVar34;
    auVar26._0_4_ = auVar32._0_4_ >> 0x1f;
    auVar26._4_4_ = auVar32._4_4_ >> 0x1f;
    auVar26._8_4_ = auVar32._8_4_ >> 0x1f;
    auVar26._12_4_ = auVar32._12_4_ >> 0x1f;
    auVar31._0_4_ = (int)(fVar36 - 2.1474836e+09);
    auVar31._4_4_ = (int)(fVar35 - 2.1474836e+09);
    auVar31._8_4_ = (int)(fVar33 - 2.1474836e+09);
    auVar31._12_4_ = (int)(fVar34 - 2.1474836e+09);
    auVar32 = auVar31 & auVar26 | auVar32;
    auVar23 = auVar32 ^ _DAT_001a7020;
    auVar27._0_4_ = -(uint)(auVar23._0_4_ < -0x7fffe000);
    auVar27._4_4_ = -(uint)(auVar23._4_4_ < -0x7fffe000);
    auVar27._8_4_ = -(uint)(auVar23._8_4_ < 0);
    auVar27._12_4_ = -(uint)(auVar23._12_4_ < 0);
    auVar28 = ~auVar27 & _DAT_001b0220 | auVar32 & auVar27;
    auVar23 = _DAT_001a7020 ^ auVar28;
    uVar21 = CONCAT44(-(uint)(-0x7ffffff8 < auVar23._4_4_),-(uint)(-0x7ffffff8 < auVar23._0_4_));
    uStack_6c = ~uVar21 & (ulong)DAT_001b0240 | auVar28._0_8_ & uVar21;
    pcVar8 = this->m_pParams;
    uVar10 = pcVar8->m_flags;
  }
  else {
    auVar23._0_4_ = pcVar8->m_crn_color_endpoint_palette_size;
    auVar23._4_4_ = pcVar8->m_crn_color_selector_palette_size;
    auVar23._8_4_ = pcVar8->m_crn_alpha_endpoint_palette_size;
    auVar23._12_4_ = pcVar8->m_crn_alpha_selector_palette_size;
    auVar30._0_4_ = -(uint)((int)auVar23._0_4_ < (int)DAT_001b01c0);
    auVar30._4_4_ = -(uint)((int)auVar23._4_4_ < DAT_001b01c0._4_4_);
    auVar30._8_4_ = -(uint)((int)auVar23._8_4_ < DAT_001b01c0._8_4_);
    auVar30._12_4_ = -(uint)((int)auVar23._12_4_ < DAT_001b01c0._12_4_);
    auVar23 = ~auVar30 & _DAT_001b01c0 | auVar23 & auVar30;
    auVar28._0_4_ = -(uint)((int)DAT_001b01d0 < auVar23._0_4_);
    auVar28._4_4_ = -(uint)(DAT_001b01d0._4_4_ < auVar23._4_4_);
    auVar28._8_4_ = -(uint)(DAT_001b01d0._8_4_ < auVar23._8_4_);
    auVar28._12_4_ = -(uint)(DAT_001b01d0._12_4_ < auVar23._12_4_);
    register0x00001240 = ~auVar28 & _DAT_001b01d0 | auVar23 & auVar28;
  }
  if ((int)uVar10 < 0) {
    console::debug("Color endpoints: %u",(ulong)(uint)local_188._276_4_);
    console::debug("Color selectors: %u",(ulong)uStack_70);
    console::debug("Alpha endpoints: %u",(ulong)(uint)uStack_6c);
    console::debug("Alpha selectors: %u");
    pcVar8 = this->m_pParams;
    uVar10 = pcVar8->m_flags;
  }
  local_188[0x111] = (bool)((byte)(uVar10 >> 1) & 1);
  local_188[0x110] = (bool)((byte)uVar10 & 1);
  local_40 = pcVar8->m_pProgress_func;
  pvStack_38 = pcVar8->m_pProgress_func_data;
  switch(pcVar8->m_format) {
  case cCRNFmtDXT1:
    local_188._268_4_ = cDXT1;
    break;
  case cCRNFmtDXT3:
    this->m_has_comp[1] = true;
    return false;
  case cCRNFmtDXT5:
    local_188._268_4_ = cDXT5;
    goto LAB_0016776c;
  case cCRNFmtDXT5_CCxY:
    local_188._268_4_ = cDXT5;
    local_58[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    local_188[0x110] = false;
    local_5c = 1.5;
    goto LAB_00167783;
  case cCRNFmtDXT5_xGxR:
  case cCRNFmtDXT5_xGBR:
  case cCRNFmtDXT5_AGBR:
    local_188._268_4_ = cDXT5;
    local_58[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_0016771b;
  case cCRNFmtDXN_XY:
    local_188._268_4_ = cDXN_XY;
    local_58[0] = 0;
    local_58[1] = 1;
    goto LAB_001676ef;
  case cCRNFmtDXN_YX:
    local_188._268_4_ = cDXN_YX;
    local_58[0] = 1;
    local_58[1] = 0;
LAB_001676ef:
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    goto LAB_0016771b;
  case cCRNFmtDXT5A:
    local_188._268_4_ = cDXT5A;
    local_58[0] = pcVar8->m_alpha_component;
    this->m_has_comp[1] = true;
LAB_0016771b:
    local_188[0x110] = false;
    goto LAB_00167783;
  case cCRNFmtETC1:
    local_188._268_4_ = cETC1;
    break;
  case cCRNFmtETC2:
    local_188._268_4_ = cETC2;
    break;
  case cCRNFmtETC2A:
    local_188._268_4_ = cETC2A;
    goto LAB_0016776c;
  case cCRNFmtETC1S:
    local_188._268_4_ = cETC1S;
    break;
  case cCRNFmtETC2AS:
    local_188._268_4_ = cETC2AS;
LAB_0016776c:
    local_58[0] = pcVar8->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_00167783;
  default:
    return false;
  }
  this->m_has_comp[0] = true;
LAB_00167783:
  local_48 = SUB41(pcVar8->m_flags >> 0x1f,0);
  local_50 = &this->m_task_pool;
  local_188._4_4_ = pcVar8->m_levels;
  if (local_188._4_4_ != 0) {
    lVar14 = 8;
    pfVar20 = (float *)(local_188 + 0x18);
    uVar21 = 0;
    do {
      plVar4 = (this->m_levels).m_p;
      *(undefined8 *)(pfVar20 + -3) = *(undefined8 *)((long)plVar4 + lVar14 + -8);
      pfVar20[-1] = *(float *)((long)&plVar4->first_block + lVar14);
      fVar35 = powf(1.3,(float)(uVar21 & 0xffffffff));
      fVar36 = 12.0;
      if (fVar35 <= 12.0) {
        fVar36 = fVar35;
      }
      *pfVar20 = fVar36;
      uVar21 = uVar21 + 1;
      pcVar8 = this->m_pParams;
      lVar14 = lVar14 + 0xc;
      pfVar20 = pfVar20 + 4;
    } while (uVar21 < pcVar8->m_levels);
  }
  local_188._8_4_ = pcVar8->m_faces;
  local_188._0_4_ = this->m_total_blocks;
  blocks = (color_quad_u8 (*) [16])crnlib_malloc((ulong)(uint)(local_188._0_4_ << 4) << 2);
  pcVar8 = this->m_pParams;
  if (pcVar8->m_levels != 0) {
    uVar21 = 0;
    uVar10 = 0;
    do {
      if (pcVar8->m_faces != 0) {
        uVar12 = 0;
        do {
          uVar1 = this->m_images[uVar12][uVar21].m_height;
          uVar15 = uVar1 + 7 >> 2 & 0x3ffffffe;
          if (uVar15 != 0) {
            uVar2 = this->m_images[uVar12][uVar21].m_width;
            uVar24 = uVar2 + 7 >> 2 & 0xfffffffe;
            uVar29 = uVar1 - 1;
            uVar19 = uVar2 - 1;
            uVar25 = 0;
            do {
              if (uVar24 != 0) {
                iVar13 = 0;
                uVar7 = 0;
                do {
                  iVar11 = 0;
                  iVar6 = 0;
                  do {
                    uVar17 = iVar11 + uVar25 * 4;
                    if (uVar29 <= uVar17) {
                      uVar17 = uVar29;
                    }
                    iVar16 = 0;
                    do {
                      uVar18 = iVar6 + iVar16;
                      uVar9 = iVar13 + iVar16;
                      if (uVar19 <= (uint)(iVar13 + iVar16)) {
                        uVar9 = uVar19;
                      }
                      pcVar5 = this->m_images[uVar12][uVar21].m_pPixels;
                      uVar9 = this->m_images[uVar12][uVar21].m_pitch * uVar17 + uVar9;
                      blocks[uVar10][uVar18].field_0.field_0.r = pcVar5[uVar9].field_0.field_0.r;
                      blocks[uVar10][uVar18].field_0.field_0.g = pcVar5[uVar9].field_0.field_0.g;
                      blocks[uVar10][uVar18].field_0.field_0.b = pcVar5[uVar9].field_0.field_0.b;
                      blocks[uVar10][uVar18].field_0.field_0.a = pcVar5[uVar9].field_0.field_0.a;
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != 4);
                    iVar11 = iVar11 + 1;
                    iVar6 = iVar6 + 4;
                  } while (iVar11 != 4);
                  uVar7 = uVar7 + 1;
                  uVar10 = uVar10 + 1;
                  iVar13 = iVar13 + 4;
                } while (uVar7 != uVar24);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar15);
            pcVar8 = this->m_pParams;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < pcVar8->m_faces);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < pcVar8->m_levels);
  }
  bVar22 = dxt_hc::compress(&this->m_hvq,blocks,&this->m_endpoint_indices,&this->m_selector_indices,
                            &this->m_color_endpoints,&this->m_alpha_endpoints,
                            &this->m_color_selectors,&this->m_alpha_selectors,(params *)local_188);
  crnlib_free(blocks);
  return bVar22;
}

Assistant:

bool crn_comp::quantize_images()
    {
        dxt_hc::params params;

        params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
        params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

        if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes)
        {
            params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }
        else
        {
            uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

            max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
            float color_quality_power_mul = 1.0f;
            float alpha_quality_power_mul = 1.0f;
            if (m_has_etc_color_blocks)
            {
                color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
                params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
            }
            if (m_pParams->m_format == cCRNFmtDXT5_CCxY)
            {
                color_quality_power_mul = 3.5f;
                alpha_quality_power_mul = .35f;
                params.m_adaptive_tile_color_psnr_derating = 5.0f;
            }
            else if (m_pParams->m_format == cCRNFmtDXT5)
            {
                color_quality_power_mul = .75f;
            }
            else if (m_pParams->m_format == cCRNFmtETC2A)
            {
                alpha_quality_power_mul = .9f;
            }

            float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
            float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
            params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
            float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
            params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
            console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
            console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
            console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
        }

        params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
        params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

        params.m_pProgress_func = m_pParams->m_pProgress_func;
        params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

        switch (m_pParams->m_format)
        {
        case cCRNFmtDXT1:
        {
            params.m_format = cDXT1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtDXT3:
        {
            m_has_comp[cAlpha0] = true;
            return false;
        }
        case cCRNFmtDXT5:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtDXT5_CCxY:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;

            //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
            params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
            break;
        }
        case cCRNFmtDXT5_xGBR:
        case cCRNFmtDXT5_AGBR:
        case cCRNFmtDXT5_xGxR:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_XY:
        {
            params.m_format = cDXN_XY;
            params.m_alpha_component_indices[0] = 0;
            params.m_alpha_component_indices[1] = 1;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_YX:
        {
            params.m_format = cDXN_YX;
            params.m_alpha_component_indices[0] = 1;
            params.m_alpha_component_indices[1] = 0;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXT5A:
        {
            params.m_format = cDXT5A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtETC1:
        {
            params.m_format = cETC1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2:
        {
            params.m_format = cETC2;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2A:
        {
            params.m_format = cETC2A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtETC1S:
        {
            params.m_format = cETC1S;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2AS:
        {
            params.m_format = cETC2AS;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        default:
        {
            return false;
        }
        }
        params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
        params.m_pTask_pool = &m_task_pool;

        params.m_num_levels = m_pParams->m_levels;
        for (uint i = 0; i < m_pParams->m_levels; i++)
        {
            params.m_levels[i].m_first_block = m_levels[i].first_block;
            params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
            params.m_levels[i].m_block_width = m_levels[i].block_width;
            params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
        }
        params.m_num_faces = m_pParams->m_faces;
        params.m_num_blocks = m_total_blocks;
        color_quad_u8(*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
        for (uint b = 0, level = 0; level < m_pParams->m_levels; level++)
        {
            for (uint face = 0; face < m_pParams->m_faces; face++)
            {
                image_u8& image = m_images[face][level];
                uint width = image.get_width();
                uint height = image.get_height();
                uint blockWidth = ((width + 7) & ~7) >> 2;
                uint blockHeight = ((height + 7) & ~7) >> 2;
                for (uint by = 0; by < blockHeight; by++)
                {
                    for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++)
                    {
                        for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++)
                        {
                            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
                            {
                                blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
                            }
                        }
                    }
                }
            }
        }
        bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
        crnlib_free(blocks);

        return result;
    }